

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkDupSingleNodes(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *p_00;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  uVar5 = p->nObjsAlloc;
  if (1 < p->iObj) {
    uVar9 = 1;
    if (1 < (int)uVar5) {
      uVar9 = uVar5;
    }
    if (uVar9 - 1 <= p->iObj - 2U) {
LAB_002fbdd4:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                    ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
  }
  if ((p->vCopies).nCap < (int)uVar5) {
    piVar6 = (p->vCopies).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar5 << 2);
    }
    (p->vCopies).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset((p->vCopies).pArray,0,(ulong)uVar5 * 4);
  }
  (p->vCopies).nSize = uVar5;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar6 = (int *)malloc(400);
  vFanins->pArray = piVar6;
  p_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar3 = p->iObj;
  if (1 < iVar3) {
    lVar12 = 1;
    do {
      if (p->nObjsAlloc <= lVar12) goto LAB_002fbdd4;
      uVar8 = *(ushort *)(p->pObjs + lVar12);
      if ((uVar8 & 0x3d) != 1) {
        pWVar1 = p->pObjs + lVar12;
        uVar8 = uVar8 & 0x3f;
        if (uVar8 == 8) {
          uVar5 = pWVar1->nFanins;
          if ((int)uVar5 < 4) goto LAB_002fbc8c;
        }
        else if (uVar8 != 0x26) {
          uVar5 = pWVar1->nFanins;
LAB_002fbc8c:
          uVar10 = (ulong)uVar5;
          if (0 < (int)uVar5) {
            lVar13 = 0;
            do {
              if ((2 < (uint)uVar10) ||
                 (paVar7 = &pWVar1->field_8,
                 (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x6)) {
                paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)(pWVar1->field_8).pFanins[0];
              }
              iVar3 = paVar7->Fanins[lVar13];
              lVar11 = (long)iVar3;
              if ((lVar11 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_002fbdd4;
              pWVar2 = p->pObjs;
              iVar4 = Wlc_ObjAlloc(p_00,1,*(uint *)(pWVar2 + lVar11) >> 6 & 1,pWVar2[lVar11].End,
                                   pWVar2[lVar11].Beg);
              if ((iVar4 < 1) || (p_00->nObjsAlloc <= iVar4)) goto LAB_002fbdd4;
              if ((p->vCopies).nSize <= iVar3) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (p->vCopies).pArray[lVar11] = iVar4;
              lVar13 = lVar13 + 1;
              uVar10 = (ulong)(int)pWVar1->nFanins;
            } while (lVar13 < (long)uVar10);
          }
          uVar5 = Wlc_ObjDup(p_00,p,(int)lVar12,vFanins);
          if (((int)uVar5 < 1) || (p_00->nObjsAlloc <= (int)uVar5)) goto LAB_002fbdd4;
          *(ushort *)(p_00->pObjs + uVar5) = *(ushort *)(p_00->pObjs + uVar5) | 0x100;
          Vec_IntPush(&p_00->vPos,uVar5);
          iVar3 = p->iObj;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar3);
    piVar6 = vFanins->pArray;
  }
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  free(vFanins);
  Wlc_NtkTransferNames(p_00,p);
  return p_00;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupSingleNodes( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Vec_Int_t * vFanins;
    Wlc_Obj_t * pObj, * pObjNew;
    Wlc_Obj_t * pFanin, * pFaninNew;
    int i, k, iFanin, iFaninNew, iObjNew, Count = 0;
    // count objects
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) )
            Count += 1 + Wlc_ObjFaninNum(pObj);
    // copy objects
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            continue;
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjFaninNum(pObj) > 3 )
            continue;
        // create CIs for the fanins
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            pFanin = Wlc_NtkObj(p, iFanin);
            iFaninNew = Wlc_ObjAlloc( pNew, WLC_OBJ_PI, pFanin->Signed, pFanin->End, pFanin->Beg );
            pFaninNew = Wlc_NtkObj(pNew, iFaninNew);
            Wlc_ObjSetCopy( p, iFanin, iFaninNew );
            //Wlc_ObjSetCi( pNew, pFaninNew );
        }
        // create object
        iObjNew = Wlc_ObjDup( pNew, p, i, vFanins );
        pObjNew = Wlc_NtkObj(pNew, iObjNew);
        pObjNew->fIsPo = 1;
        Vec_IntPush( &pNew->vPos, iObjNew );
    }
    Vec_IntFree( vFanins );
    Wlc_NtkTransferNames( pNew, p );
    return pNew;
}